

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O3

void __thiscall
jsonip::detail::struct_helper<P>::member_writer<jsonip::writer<true>>::operator()
          (member_writer<jsonip::writer<true>> *this,integral_c<int,_0> *param_1)

{
  int iVar1;
  writer<true> *this_00;
  
  writer<true>::new_member(*(writer<true> **)this,"x");
  this_00 = *(writer<true> **)this;
  iVar1 = **(int **)(this + 8);
  writer<true>::pre(this_00);
  std::ostream::_M_insert<double>((double)iVar1);
  this_00->comma = true;
  return;
}

Assistant:

void operator()(const N&)
            {
                typedef boost::fusion::extension::struct_member_name<
                    T, N::value> name_t;
                typedef typename boost::fusion::result_of::value_at<T, N>::type
                    current_t;
                typedef typename calculate_helper<current_t>::type helper_t;

                w.new_member(name_t::call());
                helper_t::write(w, boost::fusion::at<N>(t));
            }